

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intCore.c
# Opt level: O2

int Inter_ManPerformInterpolation(Aig_Man_t *pAig,Inter_ManParams_t *pPars,int *piFrame)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  abctime aVar12;
  abctime aVar13;
  Inter_Man_t *p;
  Aig_Man_t *pAVar14;
  abctime aVar15;
  Cnf_Dat_t *pCVar16;
  abctime aVar17;
  abctime aVar18;
  Aig_Man_t *pAVar19;
  int iVar20;
  int level;
  char *pcVar21;
  int iVar22;
  ulong uVar23;
  Inter_Check_t *local_118;
  long local_d8;
  Saig_ParBmc_t ParsBmc;
  
  aVar12 = Abc_Clock();
  iVar7 = pPars->nSecLimit;
  if ((long)iVar7 == 0) {
    aVar13 = 0;
  }
  else {
    aVar13 = Abc_Clock();
    aVar13 = aVar13 + (long)iVar7 * 1000000;
  }
  if (1 < pPars->nFramesK) {
    pPars->fTransLoop = 1;
  }
  if (pAig->nRegs < 1) {
    pcVar21 = "Saig_ManRegNum(pAig) > 0";
    uVar11 = 0x5e;
  }
  else if (pAig->nTruePis < 1) {
    pcVar21 = "Saig_ManPiNum(pAig) > 0";
    uVar11 = 0x5f;
  }
  else {
    if (pAig->nTruePos - pAig->nConstrs == 1) {
      if ((pAig->nConstrs != 0) && (pPars->fVerbose != 0)) {
        printf("Performing interpolation with %d constraints...\n");
      }
      iVar7 = Inter_ManCheckInitialState(pAig);
      if (iVar7 != 0) {
        *piFrame = -1;
        puts("Property trivially fails in the initial state.");
        return 0;
      }
      p = Inter_ManCreate(pAig,pPars);
      if (pPars->fTransLoop == 0) {
        pAVar14 = Inter_ManStartDuplicated(pAig);
      }
      else {
        pAVar14 = Inter_ManStartOneOutput(pAig,0);
      }
      p->pAigTrans = pAVar14;
      aVar15 = Abc_Clock();
      pCVar16 = Cnf_Derive(p->pAigTrans,p->pAigTrans->nRegs);
      p->pCnfAig = pCVar16;
      aVar17 = Abc_Clock();
      p->timeCnf = p->timeCnf + (aVar17 - aVar15);
      if (pPars->fVerbose != 0) {
        uVar11 = pAig->nRegs;
        uVar9 = pAig->nTruePis;
        uVar1 = pAig->nTruePos;
        uVar2 = pAig->nObjs[5];
        uVar8 = Aig_ManLevelNum(pAig);
        printf("AIG: PI/PO/Reg = %d/%d/%d. And = %d. Lev = %d.  CNF: Var/Cla = %d/%d.\n",
               (ulong)uVar9,(ulong)uVar1,(ulong)uVar11,(ulong)uVar2,(ulong)uVar8,
               (ulong)(uint)p->pCnfAig->nVars,(ulong)(uint)p->pCnfAig->nClauses);
      }
      *piFrame = -1;
      p->nFrames = 1;
      iVar7 = 0;
      local_d8 = 0;
      local_118 = (Inter_Check_t *)0x0;
      do {
        aVar15 = Abc_Clock();
        if (pPars->fUseBackward == 0) {
          pAVar14 = Inter_ManStartInitState(pAig->nRegs);
        }
        else {
          pAVar14 = Inter_ManStartOneOutput(pAig,1);
        }
        p->pInter = pAVar14;
        if (pAVar14->nObjs[3] != 1) {
          __assert_fail("Aig_ManCoNum(p->pInter) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCore.c"
                        ,0x91,
                        "int Inter_ManPerformInterpolation(Aig_Man_t *, Inter_ManParams_t *, int *)"
                       );
        }
        aVar17 = Abc_Clock();
        pCVar16 = Cnf_Derive(p->pInter,0);
        p->pCnfInter = pCVar16;
        aVar18 = Abc_Clock();
        p->timeCnf = p->timeCnf + (aVar18 - aVar17);
        pAVar14 = Inter_ManFramesInter(pAig,p->nFrames,pPars->fUseBackward,pPars->fUseTwoFrames);
        p->pFrames = pAVar14;
        aVar17 = Abc_Clock();
        if (pPars->fRewrite != 0) {
          pAVar14 = p->pFrames;
          pAVar19 = Dar_ManRwsat(pAVar14,1,0);
          p->pFrames = pAVar19;
          Aig_ManStop(pAVar14);
        }
        aVar18 = Abc_Clock();
        p->timeRwr = p->timeRwr + (aVar18 - aVar17);
        aVar17 = Abc_Clock();
        pAVar14 = p->pFrames;
        if (pPars->fUseBackward == 0) {
          pCVar16 = Cnf_DeriveSimple(pAVar14,0);
        }
        else {
          pCVar16 = Cnf_Derive(pAVar14,pAVar14->nObjs[3]);
        }
        p->pCnfFrames = pCVar16;
        aVar18 = Abc_Clock();
        p->timeCnf = p->timeCnf + (aVar18 - aVar17);
        if (pPars->fVerbose != 0) {
          uVar11 = p->nFrames;
          pAVar14 = p->pFrames;
          iVar20 = pAVar14->nObjs[6];
          iVar22 = pAVar14->nObjs[5];
          uVar9 = Aig_ManLevelNum(pAVar14);
          iVar10 = 0x82c23c;
          printf("Step = %2d. Frames = 1 + %d. And = %5d. Lev = %5d.  ",(ulong)(iVar7 + 1),
                 (ulong)uVar11,(ulong)(uint)(iVar20 + iVar22),(ulong)uVar9);
          Abc_Print(iVar10,"%s =","Time");
          aVar17 = Abc_Clock();
          Abc_Print(iVar10,"%9.2f sec\n",(double)(aVar17 - aVar15) / 1000000.0);
        }
        if (((pPars->fTransLoop == 0) && (pPars->fUseBackward == 0)) && (pPars->nFramesK < 2)) {
          local_118 = Inter_CheckStart(p->pAigTrans,pPars->nFramesK);
          aVar15 = Abc_Clock();
          pCVar16 = Cnf_Derive(p->pInter,1);
          aVar17 = Abc_Clock();
          p->timeCnf = p->timeCnf + (aVar17 - aVar15);
          aVar15 = Abc_Clock();
          Inter_CheckPerform(local_118,pCVar16,aVar13);
          aVar17 = Abc_Clock();
          p->timeEqu = p->timeEqu + (aVar17 - aVar15);
          Cnf_DataFree(pCVar16);
          pVVar6 = p->vInters;
          if (pVVar6 != (Vec_Ptr_t *)0x0) {
            pAVar14 = Aig_ManDupSimple(p->pInter);
            Vec_PtrPush(pVVar6,pAVar14);
          }
        }
        iVar20 = 0;
        uVar23 = 1;
        while( true ) {
          iVar22 = (int)uVar23;
          if ((pPars->nFramesMax != 0) && (pPars->nFramesMax <= p->nFrames + iVar22 + -1)) {
            if (pPars->fVerbose != 0) {
              printf("Reached limit (%d) on the number of timeframes.\n");
            }
            aVar13 = Abc_Clock();
            p->timeTotal = aVar13 - aVar12;
            goto LAB_00513358;
          }
          aVar15 = Abc_Clock();
          iVar10 = Inter_ManPerformOneStep(p,pPars->fUseBias,pPars->fUseBackward,aVar13);
          if (pPars->fVerbose != 0) {
            iVar3 = p->nFrames;
            pAVar14 = p->pInter;
            iVar4 = pAVar14->nObjs[6];
            iVar5 = pAVar14->nObjs[5];
            uVar11 = Aig_ManLevelNum(pAVar14);
            level = 0x82c2a2;
            printf("   I = %2d. Bmc =%3d. IntAnd =%6d. IntLev =%5d. Conf =%6d.  ",uVar23,
                   (ulong)(uint)(iVar3 + iVar22),(ulong)(uint)(iVar4 + iVar5),(ulong)uVar11,
                   (ulong)(uint)p->nConfCur);
            Abc_Print(level,"%s =","Time");
            aVar17 = Abc_Clock();
            Abc_Print(level,"%9.2f sec\n",(double)(aVar17 - aVar15) / 1000000.0);
          }
          iVar3 = p->nFrames;
          pPars->iFrameMax = iVar22 + iVar3 + -2;
          if (iVar10 != 1) break;
          aVar15 = Abc_Clock();
          pAVar14 = p->pInterNew;
          if (pAVar14 != (Aig_Man_t *)0x0) {
            pAVar14->Time2Quit = aVar13;
            pAVar19 = Dar_ManRwsat(pAVar14,1,0);
            p->pInterNew = pAVar19;
            Aig_ManStop(pAVar14);
            if (p->pInterNew != (Aig_Man_t *)0x0) goto LAB_00512ffc;
            uVar11 = pPars->nSecLimit;
            pcVar21 = "Reached timeout (%d seconds) during rewriting.\n";
LAB_00513374:
            printf(pcVar21,(ulong)uVar11);
            aVar13 = Abc_Clock();
            p->timeTotal = aVar13 - aVar12;
            iVar7 = 1;
            goto LAB_00513392;
          }
LAB_00512ffc:
          aVar17 = Abc_Clock();
          p->timeRwr = p->timeRwr + (aVar17 - aVar15);
          pAVar14 = p->pInterNew;
          if (pAVar14 == (Aig_Man_t *)0x0) {
LAB_0051327b:
            if (pPars->fVerbose != 0) {
              pcVar21 = "The problem is trivially true for all states.";
LAB_005132c5:
              puts(pcVar21);
            }
LAB_005132ca:
            aVar13 = Abc_Clock();
            p->timeTotal = aVar13 - aVar12;
            iVar7 = 1;
            goto LAB_005132e3;
          }
          if (pAVar14->vCos->nSize < 1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (*(ulong *)((long)*pAVar14->vCos->pArray + 8) == ((ulong)pAVar14->pConst1 ^ 1))
          goto LAB_0051327b;
          aVar15 = Abc_Clock();
          iVar10 = p->pInterNew->nObjs[2];
          iVar3 = p->pInter->nObjs[2];
          if (pPars->fCheckKstep == 0) {
            if (iVar10 != iVar3) goto LAB_005130c1;
            iVar10 = Inter_ManCheckContainment(p->pInterNew,p->pInter);
          }
          else if (iVar10 == iVar3) {
            if (((pPars->fTransLoop == 0) && (pPars->fUseBackward == 0)) && (pPars->nFramesK < 2)) {
              aVar17 = Abc_Clock();
              pCVar16 = Cnf_Derive(p->pInterNew,1);
              aVar18 = Abc_Clock();
              p->timeCnf = p->timeCnf + (aVar18 - aVar17);
              aVar18 = Abc_Clock();
              local_d8 = aVar18 - aVar17;
              iVar10 = Inter_CheckPerform(local_118,pCVar16,aVar13);
              Cnf_DataFree(pCVar16);
              pVVar6 = p->vInters;
              if (pVVar6 != (Vec_Ptr_t *)0x0) {
                pAVar14 = Aig_ManDupSimple(p->pInterNew);
                Vec_PtrPush(pVVar6,pAVar14);
              }
            }
            else {
              aVar17 = Abc_Clock();
              iVar10 = pPars->nFramesK;
              if (iVar22 < pPars->nFramesK) {
                iVar10 = iVar22;
              }
              iVar10 = Inter_ManCheckInductiveContainment
                                 (p->pAigTrans,p->pInterNew,iVar10,pPars->fUseBackward);
              aVar18 = Abc_Clock();
              local_d8 = aVar18 - aVar17;
            }
          }
          else {
LAB_005130c1:
            iVar10 = 0;
          }
          aVar17 = Abc_Clock();
          p->timeEqu = p->timeEqu + (aVar17 - (aVar15 + local_d8));
          if (iVar10 != 0) {
            if (pPars->fVerbose != 0) {
              pcVar21 = "Proved containment of interpolants.";
              goto LAB_005132c5;
            }
            goto LAB_005132ca;
          }
          if ((pPars->nSecLimit != 0) && (aVar15 = Abc_Clock(), aVar13 < aVar15)) {
            uVar11 = pPars->nSecLimit;
            pcVar21 = "Reached timeout (%d seconds).\n";
            goto LAB_00513374;
          }
          if (pPars->fTransLoop == 0) {
            pAVar14 = p->pInter;
            if (pPars->fUseBackward == 0) goto LAB_00513103;
            pAVar19 = Aig_ManCreateMiter(pAVar14,p->pInterNew,2);
            p->pInter = pAVar19;
            Aig_ManStop(pAVar14);
            Aig_ManStop(p->pInterNew);
            aVar15 = Abc_Clock();
            pAVar14 = p->pInter;
            pAVar19 = Dar_ManRwsat(pAVar14,1,0);
            p->pInter = pAVar19;
            Aig_ManStop(pAVar14);
            aVar17 = Abc_Clock();
            p->timeRwr = p->timeRwr + (aVar17 - aVar15);
          }
          else {
            pAVar14 = p->pInter;
LAB_00513103:
            Aig_ManStop(pAVar14);
            p->pInter = p->pInterNew;
          }
          p->pInterNew = (Aig_Man_t *)0x0;
          Cnf_DataFree(p->pCnfInter);
          aVar15 = Abc_Clock();
          pCVar16 = Cnf_Derive(p->pInter,0);
          p->pCnfInter = pCVar16;
          aVar17 = Abc_Clock();
          p->timeCnf = p->timeCnf + (aVar17 - aVar15);
          iVar20 = iVar20 + -1;
          uVar23 = (ulong)(iVar22 + 1);
        }
        if (iVar10 == -1) {
          if ((pPars->nSecLimit == 0) || (aVar15 = Abc_Clock(), aVar15 <= aVar13)) {
            if (p->nConfCur < p->nConfLimit) {
              __assert_fail("p->nConfCur >= p->nConfLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCore.c"
                            ,0x10d,
                            "int Inter_ManPerformInterpolation(Aig_Man_t *, Inter_ManParams_t *, int *)"
                           );
            }
            if (pPars->fVerbose == 0) goto LAB_00513317;
            pcVar21 = "Reached limit (%d) on the number of conflicts.\n";
          }
          else {
            if (pPars->fVerbose == 0) goto LAB_00513317;
            pcVar21 = "Reached timeout (%d seconds).\n";
          }
          printf(pcVar21);
LAB_00513317:
          aVar13 = Abc_Clock();
          p->timeTotal = aVar13 - aVar12;
LAB_00513358:
          iVar7 = 0;
LAB_00513392:
          Inter_ManStop(p,iVar7);
          Inter_CheckStop(local_118);
          return -1;
        }
        if (iVar10 != 0) {
          __assert_fail("RetValue == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCore.c"
                        ,0x116,
                        "int Inter_ManPerformInterpolation(Aig_Man_t *, Inter_ManParams_t *, int *)"
                       );
        }
        if (iVar20 == 0) goto LAB_005133b7;
        p->nFrames = iVar3 - iVar20;
        Inter_ManClean(p);
        Inter_CheckStop(local_118);
        iVar7 = iVar7 + 1;
      } while( true );
    }
    pcVar21 = "Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) == 1";
    uVar11 = 0x60;
  }
  __assert_fail(pcVar21,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCore.c"
                ,uVar11,"int Inter_ManPerformInterpolation(Aig_Man_t *, Inter_ManParams_t *, int *)"
               );
LAB_005133b7:
  if (pPars->fVerbose != 0) {
    printf("Found a real counterexample in frame %d.\n");
  }
  aVar13 = Abc_Clock();
  p->timeTotal = aVar13 - aVar12;
  *piFrame = p->nFrames;
  Saig_ParBmcSetDefaultParams(&ParsBmc);
  ParsBmc.nConfLimit = 100000000;
  ParsBmc.nStart = p->nFrames;
  ParsBmc.fVerbose = pPars->fVerbose;
  iVar7 = Saig_ManBmcScalable(pAig,&ParsBmc);
  if (iVar7 == 1) {
    pcVar21 = "Error: The problem should be SAT but it is UNSAT.";
  }
  else {
    if (iVar7 != -1) goto LAB_00513435;
    pcVar21 = "Error: The problem timed out.";
  }
  puts(pcVar21);
LAB_00513435:
  iVar7 = 0;
LAB_005132e3:
  Inter_ManStop(p,iVar7);
  Inter_CheckStop(local_118);
  return iVar7;
}

Assistant:

int Inter_ManPerformInterpolation( Aig_Man_t * pAig, Inter_ManParams_t * pPars, int * piFrame )
{
    extern int Inter_ManCheckInductiveContainment( Aig_Man_t * pTrans, Aig_Man_t * pInter, int nSteps, int fBackward );
    Inter_Man_t * p;
    Inter_Check_t * pCheck = NULL;
    Aig_Man_t * pAigTemp;
    int s, i, RetValue, Status;
    abctime clk, clk2, clkTotal = Abc_Clock(), timeTemp = 0;
    abctime nTimeNewOut = pPars->nSecLimit ? pPars->nSecLimit * CLOCKS_PER_SEC + Abc_Clock() : 0;

    // enable ORing of the interpolants, if containment check is performed inductively with K > 1
    if ( pPars->nFramesK > 1 )
        pPars->fTransLoop = 1;

    // sanity checks
    assert( Saig_ManRegNum(pAig) > 0 );
    assert( Saig_ManPiNum(pAig) > 0 );
    assert( Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) == 1 );
    if ( pPars->fVerbose && Saig_ManConstrNum(pAig) )
        printf( "Performing interpolation with %d constraints...\n", Saig_ManConstrNum(pAig) );

    if ( Inter_ManCheckInitialState(pAig) )
    {
        *piFrame = -1;
        printf( "Property trivially fails in the initial state.\n" );
        return 0;
    }
/*
    if ( Inter_ManCheckAllStates(pAig) )
    {
        printf( "Property trivially holds in all states.\n" );
        return 1;
    }
*/
    // create interpolation manager
    // can perform SAT sweeping and/or rewriting of this AIG...
    p = Inter_ManCreate( pAig, pPars );
    if ( pPars->fTransLoop )
        p->pAigTrans = Inter_ManStartOneOutput( pAig, 0 );
    else
        p->pAigTrans = Inter_ManStartDuplicated( pAig );
    // derive CNF for the transformed AIG
clk = Abc_Clock();
    p->pCnfAig = Cnf_Derive( p->pAigTrans, Aig_ManRegNum(p->pAigTrans) ); 
p->timeCnf += Abc_Clock() - clk;    
    if ( pPars->fVerbose )
    { 
        printf( "AIG: PI/PO/Reg = %d/%d/%d. And = %d. Lev = %d.  CNF: Var/Cla = %d/%d.\n",
            Saig_ManPiNum(pAig), Saig_ManPoNum(pAig), Saig_ManRegNum(pAig), 
            Aig_ManAndNum(pAig), Aig_ManLevelNum(pAig),
            p->pCnfAig->nVars, p->pCnfAig->nClauses );
    }
 
    // derive interpolant
    *piFrame = -1;
    p->nFrames = 1;
    for ( s = 0; ; s++ )
    {
        Cnf_Dat_t * pCnfInter2;

clk2 = Abc_Clock();
        // initial state
        if ( pPars->fUseBackward )
            p->pInter = Inter_ManStartOneOutput( pAig, 1 );
        else
            p->pInter = Inter_ManStartInitState( Aig_ManRegNum(pAig) );
        assert( Aig_ManCoNum(p->pInter) == 1 );
clk = Abc_Clock();
        p->pCnfInter = Cnf_Derive( p->pInter, 0 );  
p->timeCnf += Abc_Clock() - clk;    
        // timeframes
        p->pFrames = Inter_ManFramesInter( pAig, p->nFrames, pPars->fUseBackward, pPars->fUseTwoFrames );
clk = Abc_Clock();
        if ( pPars->fRewrite )
        {
            p->pFrames = Dar_ManRwsat( pAigTemp = p->pFrames, 1, 0 );
            Aig_ManStop( pAigTemp );
//        p->pFrames = Fra_FraigEquivence( pAigTemp = p->pFrames, 100, 0 );
//        Aig_ManStop( pAigTemp );
        }
p->timeRwr += Abc_Clock() - clk;
        // can also do SAT sweeping on the timeframes...
clk = Abc_Clock();
        if ( pPars->fUseBackward )
            p->pCnfFrames = Cnf_Derive( p->pFrames, Aig_ManCoNum(p->pFrames) );  
        else
//            p->pCnfFrames = Cnf_Derive( p->pFrames, 0 );  
            p->pCnfFrames = Cnf_DeriveSimple( p->pFrames, 0 );  
p->timeCnf += Abc_Clock() - clk;    
        // report statistics
        if ( pPars->fVerbose )
        {
            printf( "Step = %2d. Frames = 1 + %d. And = %5d. Lev = %5d.  ", 
                s+1, p->nFrames, Aig_ManNodeNum(p->pFrames), Aig_ManLevelNum(p->pFrames) );
            ABC_PRT( "Time", Abc_Clock() - clk2 );
        }


        //////////////////////////////////////////
        // start containment checking
        if ( !(pPars->fTransLoop || pPars->fUseBackward || pPars->nFramesK > 1) )
        {
            pCheck = Inter_CheckStart( p->pAigTrans, pPars->nFramesK );
            // try new containment check for the initial state
clk = Abc_Clock();
            pCnfInter2 = Cnf_Derive( p->pInter, 1 );  
p->timeCnf += Abc_Clock() - clk;    
clk = Abc_Clock();
            RetValue = Inter_CheckPerform( pCheck, pCnfInter2, nTimeNewOut );
p->timeEqu += Abc_Clock() - clk;
//            assert( RetValue == 0 );
            Cnf_DataFree( pCnfInter2 );
            if ( p->vInters )
                Vec_PtrPush( p->vInters, Aig_ManDupSimple(p->pInter) );
        }
        //////////////////////////////////////////

        // iterate the interpolation procedure
        for ( i = 0; ; i++ )
        {
            if ( pPars->nFramesMax && p->nFrames + i >= pPars->nFramesMax )
            { 
                if ( pPars->fVerbose )
                    printf( "Reached limit (%d) on the number of timeframes.\n", pPars->nFramesMax );
                p->timeTotal = Abc_Clock() - clkTotal;
                Inter_ManStop( p, 0 );
                Inter_CheckStop( pCheck );
                return -1;
            }

            // perform interpolation
            clk = Abc_Clock();
#ifdef ABC_USE_LIBRARIES
            if ( pPars->fUseMiniSat )
            {
                assert( !pPars->fUseBackward );
                RetValue = Inter_ManPerformOneStepM114p( p, pPars->fUsePudlak, pPars->fUseOther );
            }
            else 
#endif
                RetValue = Inter_ManPerformOneStep( p, pPars->fUseBias, pPars->fUseBackward, nTimeNewOut );

            if ( pPars->fVerbose )
            {
                printf( "   I = %2d. Bmc =%3d. IntAnd =%6d. IntLev =%5d. Conf =%6d.  ", 
                    i+1, i + 1 + p->nFrames, Aig_ManNodeNum(p->pInter), Aig_ManLevelNum(p->pInter), p->nConfCur );
                ABC_PRT( "Time", Abc_Clock() - clk );
            }
            // remember the number of timeframes completed
            pPars->iFrameMax = i - 1 + p->nFrames;
            if ( RetValue == 0 ) // found a (spurious?) counter-example
            {
                if ( i == 0 ) // real counterexample
                {
                    if ( pPars->fVerbose )
                        printf( "Found a real counterexample in frame %d.\n", p->nFrames );
                    p->timeTotal = Abc_Clock() - clkTotal;
                    *piFrame = p->nFrames;
//                    pAig->pSeqModel = (Abc_Cex_t *)Inter_ManGetCounterExample( pAig, p->nFrames+1, pPars->fVerbose );
                    {
                        int RetValue;
                        Saig_ParBmc_t ParsBmc, * pParsBmc = &ParsBmc;
                        Saig_ParBmcSetDefaultParams( pParsBmc );
                        pParsBmc->nConfLimit = 100000000;
                        pParsBmc->nStart     = p->nFrames;
                        pParsBmc->fVerbose   = pPars->fVerbose;
                        RetValue = Saig_ManBmcScalable( pAig, pParsBmc );
                        if ( RetValue == 1 )
                            printf( "Error: The problem should be SAT but it is UNSAT.\n" );
                        else if ( RetValue == -1 )
                            printf( "Error: The problem timed out.\n" );
                    }
                    Inter_ManStop( p, 0 );
                    Inter_CheckStop( pCheck );
                    return 0;
                }
                // likely spurious counter-example
                p->nFrames += i;
                Inter_ManClean( p ); 
                break;
            }
            else if ( RetValue == -1 ) 
            {
                if ( pPars->nSecLimit && Abc_Clock() > nTimeNewOut ) // timed out
                {
                    if ( pPars->fVerbose )
                        printf( "Reached timeout (%d seconds).\n",  pPars->nSecLimit );
                }
                else
                {
                    assert( p->nConfCur >= p->nConfLimit );
                    if ( pPars->fVerbose )
                        printf( "Reached limit (%d) on the number of conflicts.\n", p->nConfLimit );
                }
                p->timeTotal = Abc_Clock() - clkTotal;
                Inter_ManStop( p, 0 );
                Inter_CheckStop( pCheck );
                return -1;
            }
            assert( RetValue == 1 ); // found new interpolant
            // compress the interpolant
clk = Abc_Clock();
            if ( p->pInterNew )
            {
                // save the timeout value
                p->pInterNew->Time2Quit = nTimeNewOut;
//                Ioa_WriteAiger( p->pInterNew, "interpol.aig", 0, 0 );
                p->pInterNew = Dar_ManRwsat( pAigTemp = p->pInterNew, 1, 0 );
//                p->pInterNew = Dar_ManRwsat( pAigTemp = p->pInterNew, 0, 0 );
                Aig_ManStop( pAigTemp );
                if ( p->pInterNew == NULL )
                {
                    printf( "Reached timeout (%d seconds) during rewriting.\n",  pPars->nSecLimit );
                    p->timeTotal = Abc_Clock() - clkTotal;
                    Inter_ManStop( p, 1 );
                    Inter_CheckStop( pCheck );
                    return -1;
                }
            }
p->timeRwr += Abc_Clock() - clk;

            // check if interpolant is trivial
            if ( p->pInterNew == NULL || Aig_ObjChild0(Aig_ManCo(p->pInterNew,0)) == Aig_ManConst0(p->pInterNew) )
            { 
//                printf( "interpolant is constant 0\n" );
                if ( pPars->fVerbose )
                    printf( "The problem is trivially true for all states.\n" );
                p->timeTotal = Abc_Clock() - clkTotal;
                Inter_ManStop( p, 1 );
                Inter_CheckStop( pCheck );
                return 1;
            }

            // check containment of interpolants
clk = Abc_Clock();
            if ( pPars->fCheckKstep ) // k-step unique-state induction
            {
                if ( Aig_ManCiNum(p->pInterNew) == Aig_ManCiNum(p->pInter) )
                {
                    if ( pPars->fTransLoop || pPars->fUseBackward || pPars->nFramesK > 1 )
                    {
clk2 = Abc_Clock();
                        Status = Inter_ManCheckInductiveContainment( p->pAigTrans, p->pInterNew, Abc_MinInt(i + 1, pPars->nFramesK), pPars->fUseBackward );
timeTemp = Abc_Clock() - clk2;
                    }
                    else
                    {   // new containment check
clk2 = Abc_Clock();
                        pCnfInter2 = Cnf_Derive( p->pInterNew, 1 );  
p->timeCnf += Abc_Clock() - clk2;
timeTemp = Abc_Clock() - clk2;
            
                        Status = Inter_CheckPerform( pCheck, pCnfInter2, nTimeNewOut );
                        Cnf_DataFree( pCnfInter2 );
                        if ( p->vInters )
                            Vec_PtrPush( p->vInters, Aig_ManDupSimple(p->pInterNew) );
                    }
                }
                else
                    Status = 0;
            }
            else // combinational containment
            {
                if ( Aig_ManCiNum(p->pInterNew) == Aig_ManCiNum(p->pInter) )
                    Status = Inter_ManCheckContainment( p->pInterNew, p->pInter );
                else
                    Status = 0;
            }
p->timeEqu += Abc_Clock() - clk - timeTemp;
            if ( Status ) // contained
            {
                if ( pPars->fVerbose )
                    printf( "Proved containment of interpolants.\n" );
                p->timeTotal = Abc_Clock() - clkTotal;
                Inter_ManStop( p, 1 );
                Inter_CheckStop( pCheck );
                return 1;
            }
            if ( pPars->nSecLimit && Abc_Clock() > nTimeNewOut )
            {
                printf( "Reached timeout (%d seconds).\n",  pPars->nSecLimit );
                p->timeTotal = Abc_Clock() - clkTotal;
                Inter_ManStop( p, 1 );
                Inter_CheckStop( pCheck );
                return -1;
            }
            // save interpolant and convert it into CNF
            if ( pPars->fTransLoop )
            {
                Aig_ManStop( p->pInter );
                p->pInter = p->pInterNew; 
            }
            else
            {
                if ( pPars->fUseBackward )
                {
                    p->pInter = Aig_ManCreateMiter( pAigTemp = p->pInter, p->pInterNew, 2 );
                    Aig_ManStop( pAigTemp );
                    Aig_ManStop( p->pInterNew );
                    // compress the interpolant
clk = Abc_Clock();
                    p->pInter = Dar_ManRwsat( pAigTemp = p->pInter, 1, 0 );
                    Aig_ManStop( pAigTemp );
p->timeRwr += Abc_Clock() - clk;
                }
                else // forward with the new containment checking (using only the frontier)
                {
                    Aig_ManStop( p->pInter );
                    p->pInter = p->pInterNew; 
                }
            }
            p->pInterNew = NULL;
            Cnf_DataFree( p->pCnfInter );
clk = Abc_Clock();
            p->pCnfInter = Cnf_Derive( p->pInter, 0 );  
p->timeCnf += Abc_Clock() - clk;
        }

        // start containment checking
        Inter_CheckStop( pCheck );
    }
    assert( 0 );
    return RetValue;
}